

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<int>::ExtractSubrange
          (RepeatedField<int> *this,int start,int num,int *elements)

{
  LogMessage *pLVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  LogMessage local_80;
  int *local_48;
  ulong local_40;
  LogFinisher local_31;
  
  local_48 = elements;
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x563);
    pLVar1 = internal::LogMessage::operator<<(&local_80,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(&local_31,pLVar1);
    internal::LogMessage::~LogMessage(&local_80);
  }
  if (num < 0) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x564);
    pLVar1 = internal::LogMessage::operator<<(&local_80,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_31,pLVar1);
    internal::LogMessage::~LogMessage(&local_80);
  }
  local_40 = (ulong)(uint)num;
  if (this->current_size_ < num + start) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x565);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_80,"CHECK failed: (start + num) <= (this->current_size_): ");
    internal::LogFinisher::operator=(&local_31,pLVar1);
    internal::LogMessage::~LogMessage(&local_80);
  }
  if (local_48 != (int *)0x0) {
    uVar4 = 0;
    uVar3 = 0;
    if (0 < (int)local_40) {
      uVar3 = local_40 & 0xffffffff;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      piVar2 = Get(this,start + (int)uVar4);
      local_48[uVar4] = *piVar2;
    }
  }
  iVar5 = (int)local_40;
  if (0 < iVar5) {
    while( true ) {
      if (this->current_size_ <= iVar5 + start) break;
      piVar2 = Get(this,iVar5 + start);
      Set(this,start,piVar2);
      start = start + 1;
    }
    Truncate(this,this->current_size_ - iVar5);
  }
  return;
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, this->current_size_);

  // Save the values of the removed elements if requested.
  if (elements != NULL) {
    for (int i = 0; i < num; ++i) elements[i] = this->Get(i + start);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < this->current_size_; ++i)
      this->Set(i - num, this->Get(i));
    this->Truncate(this->current_size_ - num);
  }
}